

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  undefined8 uVar1;
  uint size;
  uint bucketCount;
  uint uVar2;
  EntryType *dst;
  long lVar3;
  int i;
  long lVar4;
  int *local_48;
  int *newBuckets;
  int local_34 [2];
  int modIndex;
  
  size = this->count * 2;
  local_34[0] = 0x4b;
  bucketCount = DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>::GetBucketSize(size,local_34);
  local_48 = (Type)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    dst = AllocateEntries(this,size,true);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<unsigned_long,void*>,void*,Memory::HeapAllocator>
              (dst,(long)(int)size,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = size;
    this->modFunctionIndex = local_34[0];
  }
  else {
    Allocate(this,&local_48,(EntryType **)&newBuckets,bucketCount,size);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<unsigned_long,void*>,void*,Memory::HeapAllocator>
              ((SimpleDictionaryEntry<unsigned_long,_void_*> *)newBuckets,(long)(int)size,
               this->entries,(long)this->count);
    this->modFunctionIndex = local_34[0];
    lVar3 = 8;
    for (lVar4 = 0; lVar4 < this->count; lVar4 = lVar4 + 1) {
      if (-2 < *(int *)((long)newBuckets + lVar3)) {
        uVar1 = *(undefined8 *)((long)newBuckets + lVar3 + 8);
        uVar2 = GetBucket(((uint)((ulong)uVar1 >> 0x20) ^ (uint)uVar1) * 2 + 1,bucketCount,
                          this->modFunctionIndex);
        *(int *)((long)newBuckets + lVar3) = local_48[(int)uVar2];
        local_48[(int)uVar2] = (int)lVar4;
      }
      lVar3 = lVar3 + 0x18;
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,size,size - this->size);
    }
    this->buckets = local_48;
    this->entries = (Type)newBuckets;
    this->bucketCount = bucketCount;
    this->size = size;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }